

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t Address_01;
  DecodeStatus DVar4;
  uint RegNo;
  
  RegNo = Val >> 6 & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  if (((0x15 < uVar1 - 0xa2d) ||
      (Decoder = &x86DisassemblerTwoByteOpcodes[0x3c].modRMDecisions[100].field_0x1,
      (0x204001U >> (uVar1 - 0xa2d & 0x1f) & 1) == 0)) ||
     (DVar4 = MCDisassembler_Fail, RegNo != 0xf)) {
    DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
    DVar4 = MCDisassembler_Fail;
    if ((DVar2 | 2) == MCDisassembler_Success) {
      DVar3 = DecoderGPRRegisterClass(Inst,Val >> 2 & 0xf,Address_01,Decoder);
      DVar4 = DVar2;
      if (DVar3 != MCDisassembler_Success) {
        if (DVar3 != MCDisassembler_SoftFail) {
          return MCDisassembler_Fail;
        }
        DVar4 = MCDisassembler_SoftFail;
      }
      MCOperand_CreateImm0(Inst,(ulong)(Val & 3));
    }
  }
  return DVar4;
}

Assistant:

static DecodeStatus DecodeT2AddrModeSOReg(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 6, 4);
	unsigned Rm = fieldFromInstruction_4(Val, 2, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 2);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRHs:
		case ARM_t2STRBs:
		case ARM_t2STRs:
			if (Rn == 15)
				return MCDisassembler_Fail;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}